

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm_x86_fma::forward
          (Gemm_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  const_reference pvVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  float *pfVar5;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar6;
  int in_stack_00000060;
  int in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000088;
  int in_stack_00000090;
  Option *in_stack_00000098;
  int i_1;
  int size_1;
  Mat *B_3;
  Mat *A_3;
  Mat *A_2;
  Mat *B_2;
  int ret;
  int _nT;
  Mat *top_blob;
  size_t out_elemsize;
  int outh;
  int out_elempack;
  int i;
  int size;
  Mat C2;
  int in_stack_000003b0;
  int in_stack_000003b8;
  int in_stack_000003c0;
  int in_stack_000003c8;
  int in_stack_000003d0;
  int in_stack_000003d8;
  Option *in_stack_000003e0;
  int broadcast_type_C;
  Mat C;
  Mat *B_1;
  Mat *A_1;
  Mat *A;
  Mat *B;
  int N;
  int M;
  undefined4 in_stack_fffffffffffff760;
  int in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  undefined4 in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  undefined8 in_stack_fffffffffffff778;
  Mat *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  int local_800;
  int local_7fc;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_678;
  int local_64c;
  int local_62c;
  int local_628;
  Mat local_620;
  Mat local_5d8;
  Mat local_590;
  void *local_548;
  int *local_540;
  size_t local_538;
  int local_530;
  Mat *local_528;
  int in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  int iVar7;
  Mat *in_stack_fffffffffffffae8;
  Mat *in_stack_fffffffffffffaf0;
  Mat *in_stack_fffffffffffffaf8;
  size_t sVar8;
  Mat *in_stack_fffffffffffffb00;
  void *__ptr;
  int *local_4f8;
  Option *in_stack_fffffffffffffb10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffb18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffb20;
  Mat *pMVar9;
  int iVar10;
  undefined4 uVar11;
  Gemm_x86_fma *in_stack_fffffffffffffb28;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  size_t local_4c0;
  void *local_4a0;
  int *local_498;
  size_t local_490;
  int in_stack_fffffffffffffb7c;
  Mat *top_blob_00;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Mat *in_stack_fffffffffffffb98;
  size_t local_460;
  int local_438;
  int local_434;
  int local_40c;
  int in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  Mat *in_stack_fffffffffffffc58;
  Mat *in_stack_fffffffffffffc60;
  Mat *in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  Mat *in_stack_fffffffffffffd10;
  Mat *in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  Option *in_stack_ffffffffffffff88;
  
  if (*(int *)(in_RDI + 0x10c) == 0) {
    if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
      if (*(int *)(in_RDI + 0xe0) == 0) {
        if (*(int *)(in_RDI + 0xe4) == 0) {
          pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
          if (*(int *)(in_RDI + 0xd8) == 0) {
            if (pvVar3->dims == 3) {
              local_698 = pvVar3->c;
            }
            else {
              local_698 = pvVar3->h;
            }
            local_694 = local_698 * pvVar3->elempack;
          }
          else {
            local_694 = pvVar3->w;
          }
          local_434 = local_694;
          if (*(int *)(in_RDI + 0xdc) == 0) {
            local_6a0 = pvVar1->w;
          }
          else {
            if (pvVar1->dims == 3) {
              local_69c = pvVar1->c;
            }
            else {
              local_69c = pvVar1->h;
            }
            local_6a0 = local_69c * pvVar1->elempack;
          }
          local_438 = local_6a0;
        }
        else {
          pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          if (*(int *)(in_RDI + 0xd8) == 0) {
            if (pvVar3->dims == 3) {
              local_690 = pvVar3->c;
            }
            else {
              local_690 = pvVar3->h;
            }
            local_68c = local_690 * pvVar3->elempack;
          }
          else {
            local_68c = pvVar3->w;
          }
          local_434 = local_68c;
          local_438 = *(int *)(in_RDI + 0xf0);
        }
      }
      else {
        pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        local_434 = *(int *)(in_RDI + 0xec);
        if (*(int *)(in_RDI + 0xdc) == 0) {
          local_688 = pvVar3->w;
        }
        else {
          if (pvVar3->dims == 3) {
            local_684 = pvVar3->c;
          }
          else {
            local_684 = pvVar3->h;
          }
          local_688 = local_684 * pvVar3->elempack;
        }
        local_438 = local_688;
      }
    }
    else {
      local_434 = *(int *)(in_RDI + 0xec);
      local_438 = *(int *)(in_RDI + 0xf0);
    }
    local_4a0 = (void *)0x0;
    local_498 = (int *)0x0;
    local_490 = 0;
    iVar16 = 0;
    top_blob_00 = (Mat *)0x0;
    iVar17 = 0;
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    iVar15 = 0;
    local_460 = 0;
    if (*(int *)(in_RDI + 0xe8) == 0) {
      if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
        if (*(int *)(in_RDI + 0xe0) == 0) {
          if (*(int *)(in_RDI + 0xe4) == 0) {
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
            if (sVar2 == 3) {
              pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
              local_5d8.data = pvVar3->data;
              local_5d8.refcount = pvVar3->refcount;
              local_5d8.elemsize = pvVar3->elemsize;
              local_5d8.elempack = pvVar3->elempack;
              local_5d8.allocator = pvVar3->allocator;
              local_5d8.dims = pvVar3->dims;
              local_5d8.w = pvVar3->w;
              local_5d8.h = pvVar3->h;
              local_5d8.d = pvVar3->d;
              local_5d8.c = pvVar3->c;
              local_5d8.cstep = pvVar3->cstep;
              if (local_5d8.refcount != (int *)0x0) {
                LOCK();
                *local_5d8.refcount = *local_5d8.refcount + 1;
                UNLOCK();
              }
            }
            else {
              local_5d8.data = (void *)0x0;
              local_5d8.refcount = (int *)0x0;
              local_5d8.elemsize = 0;
              local_5d8.elempack = 0;
              local_5d8.allocator = (Allocator *)0x0;
              local_5d8.dims = 0;
              local_5d8.w = 0;
              local_5d8.h = 0;
              local_5d8.d = 0;
              local_5d8.c = 0;
              local_5d8.cstep = 0;
            }
            if ((Mat *)&local_4a0 != &local_5d8) {
              if (local_5d8.refcount != (int *)0x0) {
                LOCK();
                *local_5d8.refcount = *local_5d8.refcount + 1;
                UNLOCK();
              }
              if (local_498 != (int *)0x0) {
                LOCK();
                iVar16 = *local_498;
                *local_498 = *local_498 + -1;
                UNLOCK();
                if (iVar16 == 1) {
                  if (top_blob_00 == (Mat *)0x0) {
                    if (local_4a0 != (void *)0x0) {
                      free(local_4a0);
                    }
                  }
                  else {
                    (**(_func_int **)((long)top_blob_00->data + 0x18))(top_blob_00,local_4a0);
                  }
                }
              }
              iVar16 = 0;
              local_4a0 = local_5d8.data;
              local_498 = local_5d8.refcount;
              local_490 = local_5d8.elemsize;
              local_460 = local_5d8.cstep;
              iVar16 = local_5d8.elempack;
              top_blob_00 = (Mat *)local_5d8.allocator;
              iVar17 = local_5d8.dims;
              iVar12 = local_5d8.w;
              iVar13 = local_5d8.h;
              iVar14 = local_5d8.d;
            }
            in_stack_fffffffffffffc58 = &local_5d8;
            if (local_5d8.refcount != (int *)0x0) {
              LOCK();
              iVar15 = *local_5d8.refcount;
              *local_5d8.refcount = *local_5d8.refcount + -1;
              UNLOCK();
              if (iVar15 == 1) {
                if ((Mat *)local_5d8.allocator == (Mat *)0x0) {
                  if (local_5d8.data != (void *)0x0) {
                    free(local_5d8.data);
                  }
                  in_stack_ffffffffffffff68 = (int)local_5d8.data;
                }
                else {
                  (*(local_5d8.allocator)->_vptr_Allocator[3])(local_5d8.allocator,local_5d8.data);
                }
              }
            }
            local_5d8.data = (void *)0x0;
            local_5d8.elemsize = 0;
            local_5d8.elempack = 0;
            local_5d8.dims = 0;
            local_5d8.w = 0;
            local_5d8.h = 0;
            local_5d8.d = 0;
            local_5d8.c = 0;
            local_5d8.cstep = 0;
            local_5d8.refcount = (int *)0x0;
          }
          else {
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
            if (sVar2 == 2) {
              pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
              local_590.data = pvVar3->data;
              local_590.refcount = pvVar3->refcount;
              local_590.elemsize = pvVar3->elemsize;
              local_590.elempack = pvVar3->elempack;
              local_590.allocator = pvVar3->allocator;
              local_590.dims = pvVar3->dims;
              local_590.w = pvVar3->w;
              local_590.h = pvVar3->h;
              local_590.d = pvVar3->d;
              local_590.c = pvVar3->c;
              local_590.cstep = pvVar3->cstep;
              if (local_590.refcount != (int *)0x0) {
                LOCK();
                *local_590.refcount = *local_590.refcount + 1;
                UNLOCK();
              }
            }
            else {
              local_590.data = (void *)0x0;
              local_590.refcount = (int *)0x0;
              local_590.elemsize = 0;
              local_590.elempack = 0;
              local_590.allocator = (Allocator *)0x0;
              local_590.dims = 0;
              local_590.w = 0;
              local_590.h = 0;
              local_590.d = 0;
              local_590.c = 0;
              local_590.cstep = 0;
            }
            if ((Mat *)&local_4a0 != &local_590) {
              if (local_590.refcount != (int *)0x0) {
                LOCK();
                *local_590.refcount = *local_590.refcount + 1;
                UNLOCK();
              }
              if (local_498 != (int *)0x0) {
                LOCK();
                iVar16 = *local_498;
                *local_498 = *local_498 + -1;
                UNLOCK();
                if (iVar16 == 1) {
                  if (top_blob_00 == (Mat *)0x0) {
                    if (local_4a0 != (void *)0x0) {
                      free(local_4a0);
                    }
                  }
                  else {
                    (**(_func_int **)((long)top_blob_00->data + 0x18))(top_blob_00,local_4a0);
                  }
                }
              }
              iVar16 = 0;
              local_4a0 = local_590.data;
              local_498 = local_590.refcount;
              local_490 = local_590.elemsize;
              local_460 = local_590.cstep;
              iVar16 = local_590.elempack;
              top_blob_00 = (Mat *)local_590.allocator;
              iVar17 = local_590.dims;
              iVar12 = local_590.w;
              iVar13 = local_590.h;
              iVar14 = local_590.d;
            }
            in_stack_fffffffffffffd10 = &local_590;
            if (local_590.refcount != (int *)0x0) {
              in_stack_fffffffffffffd0c = -1;
              LOCK();
              in_stack_fffffffffffffd08 = *local_590.refcount;
              *local_590.refcount = *local_590.refcount + -1;
              UNLOCK();
              if (in_stack_fffffffffffffd08 == 1) {
                if ((Mat *)local_590.allocator == (Mat *)0x0) {
                  if (local_590.data != (void *)0x0) {
                    free(local_590.data);
                  }
                  in_stack_ffffffffffffff58 = (int)local_590.data;
                }
                else {
                  (*(local_590.allocator)->_vptr_Allocator[3])(local_590.allocator,local_590.data);
                }
              }
            }
            local_590.data = (void *)0x0;
            local_590.elemsize = 0;
            local_590.elempack = 0;
            local_590.dims = 0;
            local_590.w = 0;
            local_590.h = 0;
            local_590.d = 0;
            local_590.c = 0;
            local_590.cstep = 0;
            local_590.refcount = (int *)0x0;
          }
        }
        else {
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
          if (sVar2 == 2) {
            pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
            local_548 = pvVar3->data;
            local_540 = pvVar3->refcount;
            local_538 = pvVar3->elemsize;
            local_530 = pvVar3->elempack;
            local_528 = (Mat *)pvVar3->allocator;
            iVar15 = pvVar3->dims;
            iVar10 = pvVar3->w;
            iVar7 = pvVar3->h;
            iVar7 = pvVar3->d;
            iVar7 = pvVar3->c;
            sVar8 = pvVar3->cstep;
            if (local_540 != (int *)0x0) {
              LOCK();
              *local_540 = *local_540 + 1;
              UNLOCK();
            }
          }
          else {
            local_548 = (void *)0x0;
            local_540 = (int *)0x0;
            local_538 = 0;
            local_530 = 0;
            local_528 = (Mat *)0x0;
            iVar15 = 0;
            iVar10 = 0;
            uVar11 = 0;
            uVar11 = 0;
            uVar11 = 0;
            sVar8 = 0;
          }
          if (&local_4a0 != &local_548) {
            if (local_540 != (int *)0x0) {
              LOCK();
              *local_540 = *local_540 + 1;
              UNLOCK();
            }
            if (local_498 != (int *)0x0) {
              LOCK();
              iVar16 = *local_498;
              *local_498 = *local_498 + -1;
              UNLOCK();
              if (iVar16 == 1) {
                if (top_blob_00 == (Mat *)0x0) {
                  if (local_4a0 != (void *)0x0) {
                    free(local_4a0);
                  }
                }
                else {
                  (**(_func_int **)((long)top_blob_00->data + 0x18))(top_blob_00,local_4a0);
                }
              }
            }
            iVar16 = 0;
            local_4a0 = local_548;
            local_498 = local_540;
            local_490 = local_538;
            iVar13 = (int)in_stack_fffffffffffffae8;
            iVar14 = (int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
            iVar16 = (int)in_stack_fffffffffffffaf0;
            iVar16 = local_530;
            top_blob_00 = local_528;
            iVar17 = iVar15;
            iVar12 = iVar10;
            local_460 = sVar8;
          }
          if (local_540 != (int *)0x0) {
            in_stack_fffffffffffffd2c = 0xffffffff;
            LOCK();
            in_stack_fffffffffffffd28 = *local_540;
            *local_540 = *local_540 + -1;
            UNLOCK();
            if (in_stack_fffffffffffffd28 == 1) {
              if (local_528 == (Mat *)0x0) {
                if (local_548 != (void *)0x0) {
                  free(local_548);
                }
              }
              else {
                (**(_func_int **)((long)local_528->data + 0x18))(local_528,local_548);
              }
            }
          }
          local_548 = (void *)0x0;
          local_538 = 0;
          local_530 = 0;
          in_stack_fffffffffffffae0 = 0;
          in_stack_fffffffffffffae4 = 0;
          uVar11 = 0;
          uVar11 = 0;
          in_stack_fffffffffffffaf8 = (Mat *)0x0;
          local_540 = (int *)0x0;
        }
      }
      else {
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
        if (sVar2 == 1) {
          pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          __ptr = pvVar3->data;
          local_4f8 = pvVar3->refcount;
          sVar8 = pvVar3->elemsize;
          iVar15 = pvVar3->elempack;
          pMVar9 = (Mat *)pvVar3->allocator;
          iVar10 = pvVar3->dims;
          iVar10 = pvVar3->w;
          local_4d0 = pvVar3->h;
          local_4cc = pvVar3->d;
          local_4c8 = pvVar3->c;
          local_4c0 = pvVar3->cstep;
          if (local_4f8 != (int *)0x0) {
            LOCK();
            *local_4f8 = *local_4f8 + 1;
            UNLOCK();
          }
        }
        else {
          __ptr = (void *)0x0;
          local_4f8 = (int *)0x0;
          sVar8 = 0;
          iVar15 = 0;
          pMVar9 = (Mat *)0x0;
          uVar11 = 0;
          uVar11 = 0;
          local_4d0 = 0;
          local_4cc = 0;
          local_4c8 = 0;
          local_4c0 = 0;
        }
        if (&local_4a0 != (void **)&stack0xfffffffffffffb00) {
          if (local_4f8 != (int *)0x0) {
            LOCK();
            *local_4f8 = *local_4f8 + 1;
            UNLOCK();
          }
          iVar16 = iVar15;
          if (local_498 != (int *)0x0) {
            LOCK();
            iVar17 = *local_498;
            *local_498 = *local_498 + -1;
            UNLOCK();
            if (iVar17 == 1) {
              if (top_blob_00 == (Mat *)0x0) {
                if (local_4a0 != (void *)0x0) {
                  free(local_4a0);
                }
              }
              else {
                (**(_func_int **)((long)top_blob_00->data + 0x18))(top_blob_00,local_4a0);
                iVar16 = iVar15;
              }
            }
          }
          iVar17 = 0;
          local_498 = local_4f8;
          iVar17 = (int)in_stack_fffffffffffffb28;
          iVar12 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
          local_460 = local_4c0;
          top_blob_00 = pMVar9;
          iVar13 = local_4d0;
          iVar14 = local_4cc;
          local_4a0 = __ptr;
          local_490 = sVar8;
        }
        if (local_4f8 != (int *)0x0) {
          LOCK();
          iVar15 = *local_4f8;
          *local_4f8 = *local_4f8 + -1;
          UNLOCK();
          if (iVar15 == 1) {
            if (pMVar9 == (Mat *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(_func_int **)((long)pMVar9->data + 0x18))(pMVar9,__ptr);
            }
          }
        }
        in_stack_fffffffffffffb00 = (Mat *)0x0;
      }
      if ((local_4a0 != (void *)0x0 && local_460 * (long)(int)in_stack_fffffffffffffb98 != 0) &&
         ((*(float *)(in_RDI + 0xd4) != 1.0 || (NAN(*(float *)(in_RDI + 0xd4)))))) {
        local_620.data = (void *)0x0;
        local_620.refcount = (int *)0x0;
        local_620.elemsize = 0;
        local_620.elempack = 0;
        local_620.allocator = (Allocator *)0x0;
        local_620.dims = 0;
        local_620.w = 0;
        local_620.h = 0;
        local_620.d = 0;
        local_620.c = 0;
        local_620.cstep = 0;
        Mat::create_like((Mat *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         (Mat *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                         (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760))
        ;
        for (local_628 = 0; local_628 < (int)local_460 * (int)in_stack_fffffffffffffb98 * iVar16;
            local_628 = local_628 + 1) {
          *(float *)((long)local_620.data + (long)local_628 * 4) =
               *(float *)((long)local_4a0 + (long)local_628 * 4) * *(float *)(in_RDI + 0xd4);
        }
        if ((Mat *)&local_4a0 != &local_620) {
          if (local_620.refcount != (int *)0x0) {
            LOCK();
            *local_620.refcount = *local_620.refcount + 1;
            UNLOCK();
          }
          if (local_498 != (int *)0x0) {
            LOCK();
            iVar16 = *local_498;
            *local_498 = *local_498 + -1;
            UNLOCK();
            if (iVar16 == 1) {
              if (top_blob_00 == (Mat *)0x0) {
                if (local_4a0 != (void *)0x0) {
                  free(local_4a0);
                }
              }
              else {
                (**(_func_int **)((long)top_blob_00->data + 0x18))(top_blob_00,local_4a0);
              }
            }
          }
          iVar16 = 0;
          local_4a0 = local_620.data;
          local_498 = local_620.refcount;
          local_490 = local_620.elemsize;
          iVar16 = local_620.elempack;
          top_blob_00 = (Mat *)local_620.allocator;
          iVar17 = local_620.dims;
          iVar12 = local_620.w;
          iVar13 = local_620.h;
          iVar14 = local_620.d;
        }
        in_stack_fffffffffffffc68 = &local_620;
        if (local_620.refcount != (int *)0x0) {
          LOCK();
          iVar15 = *local_620.refcount;
          *local_620.refcount = *local_620.refcount + -1;
          UNLOCK();
          if (iVar15 == 1) {
            if ((Mat *)local_620.allocator == (Mat *)0x0) {
              if (local_620.data != (void *)0x0) {
                free(local_620.data);
              }
              in_stack_ffffffffffffff78 = (int)local_620.data;
            }
            else {
              (*(local_620.allocator)->_vptr_Allocator[3])(local_620.allocator,local_620.data);
            }
          }
        }
        local_620.data = (void *)0x0;
        local_620.elemsize = 0;
        local_620.elempack = 0;
        local_620.dims = 0;
        local_620.w = 0;
        local_620.h = 0;
        local_620.d = 0;
        local_620.c = 0;
        local_620.cstep = 0;
        local_620.refcount = (int *)0x0;
      }
    }
    else if (&local_4a0 != (void **)(in_RDI + 0x2d8)) {
      if (*(long *)(in_RDI + 0x2e0) != 0) {
        LOCK();
        **(int **)(in_RDI + 0x2e0) = **(int **)(in_RDI + 0x2e0) + 1;
        UNLOCK();
      }
      iVar16 = 0;
      local_4a0 = *(void **)(in_RDI + 0x2d8);
      local_498 = *(int **)(in_RDI + 0x2e0);
      local_490 = *(size_t *)(in_RDI + 0x2e8);
      iVar16 = *(int *)(in_RDI + 0x2f0);
      top_blob_00 = *(Mat **)(in_RDI + 0x2f8);
      iVar17 = *(int *)(in_RDI + 0x300);
      iVar12 = *(int *)(in_RDI + 0x304);
      iVar13 = *(int *)(in_RDI + 0x308);
      iVar14 = *(int *)(in_RDI + 0x30c);
      iVar15 = *(int *)(in_RDI + 0x310);
    }
    local_62c = 1;
    if ((*(byte *)(in_RCX + 0x27) & 1) != 0) {
      if (*(int *)(in_RDI + 0x108) == 0) {
        local_7fc = local_434;
      }
      else {
        local_7fc = local_438;
      }
      if (local_7fc % 8 == 0) {
        local_800 = 8;
      }
      else {
        local_800 = 1;
        if (local_7fc % 4 == 0) {
          local_800 = 4;
        }
      }
      local_62c = local_800;
    }
    if (*(int *)(in_RDI + 0x100) != 0) {
      local_62c = *(int *)(in_RDI + 0x100);
    }
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
    iVar15 = (int)in_stack_fffffffffffff778;
    iVar10 = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
    if (*(int *)(in_RDI + 0x108) == 0) {
      if (*(int *)(in_RDI + 0xfc) == 0) {
        Mat::create(in_stack_fffffffffffff780,iVar10,iVar15,
                    CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                    in_stack_fffffffffffff76c,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
      }
      else {
        Mat::create(in_stack_fffffffffffff780,iVar10,iVar15,in_stack_fffffffffffff774,
                    CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                    in_stack_fffffffffffff764,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
      }
    }
    else if (*(int *)(in_RDI + 0xfc) == 0) {
      Mat::create(in_stack_fffffffffffff780,iVar10,iVar15,
                  CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                  in_stack_fffffffffffff76c,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    }
    else {
      Mat::create(in_stack_fffffffffffff780,iVar10,iVar15,in_stack_fffffffffffff774,
                  CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                  in_stack_fffffffffffff764,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
    }
    bVar6 = true;
    if (pvVar4->data != (void *)0x0) {
      bVar6 = pvVar4->cstep * (long)pvVar4->c == 0;
    }
    if (bVar6) {
      local_40c = -100;
    }
    else {
      if ((*(int *)(in_RDI + 0x244) != 0) && (*(int *)(in_RCX + 4) != *(int *)(in_RDI + 0x244))) {
        fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d",
                (ulong)*(uint *)(in_RCX + 4),(ulong)*(uint *)(in_RDI + 0x244));
        fprintf(_stderr,"\n");
      }
      if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
        if (*(int *)(in_RDI + 0xe0) == 0) {
          if (*(int *)(in_RDI + 0xe4) == 0) {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
            local_64c = gemm_x86((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ),in_stack_fffffffffffffd20,
                                 in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                                 in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08,
                                 in_stack_000003b0,in_stack_000003b8,in_stack_000003c0,
                                 in_stack_000003c8,in_stack_000003d0,in_stack_000003d8,
                                 in_stack_000003e0);
          }
          else {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
            local_64c = gemm_BT_x86(in_stack_fffffffffffffb98,(Mat *)CONCAT44(iVar14,iVar13),
                                    (Mat *)CONCAT44(iVar12,iVar17),top_blob_00,
                                    in_stack_fffffffffffffb7c,iVar16,in_stack_00000060,
                                    in_stack_00000068,in_stack_00000070,in_stack_00000078,
                                    in_stack_00000080,in_stack_00000088,in_stack_00000090,
                                    in_stack_00000098);
          }
        }
        else {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          local_64c = gemm_AT_x86(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                                  in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                                  in_stack_fffffffffffffc54,in_stack_fffffffffffffc50,
                                  (int)out_elemsize,outh,i,(int)C2.data,(int)C2.refcount,
                                  (int)C2.elemsize,C2.elempack,(Option *)C2.allocator);
        }
      }
      else {
        local_64c = gemm_AT_BT_x86(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                                   in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                                   in_stack_fffffffffffffae4,in_stack_fffffffffffffae0,
                                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                   in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
      }
      if (local_64c == 0) {
        if ((*(float *)(in_RDI + 0xd0) != 1.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
          sVar8 = pvVar4->cstep;
          iVar16 = pvVar4->c;
          for (local_678 = 0; local_678 < (int)sVar8 * iVar16 * local_62c; local_678 = local_678 + 1
              ) {
            pfVar5 = (float *)((long)pvVar4->data + (long)local_678 * 4);
            *pfVar5 = *(float *)(in_RDI + 0xd0) * *pfVar5;
          }
        }
        local_40c = 0;
      }
      else {
        local_40c = local_64c;
      }
    }
    if (local_498 != (int *)0x0) {
      LOCK();
      iVar16 = *local_498;
      *local_498 = *local_498 + -1;
      UNLOCK();
      if (iVar16 == 1) {
        if (top_blob_00 == (Mat *)0x0) {
          if (local_4a0 != (void *)0x0) {
            free(local_4a0);
          }
        }
        else {
          (**(_func_int **)((long)top_blob_00->data + 0x18))(top_blob_00,local_4a0);
        }
      }
    }
  }
  else {
    local_40c = forward_int8(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                             in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  }
  return local_40c;
}

Assistant:

int Gemm_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        // return Gemm::forward_int8(bottom_blobs, top_blobs, opt);
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    if (ret != 0)
        return ret;

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return 0;
}